

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-desc.c
# Opt level: O2

size_t obj_desc_name_format(char *buf,size_t max,size_t end,char *fmt,char *modstr,_Bool pluralise)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  undefined7 in_register_00000089;
  size_t end_local;
  uint local_40;
  undefined4 local_3c;
  char *local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000089,pluralise);
  uVar4 = (uint)pluralise;
  end_local = end;
  do {
    cVar1 = *fmt;
    while (cVar1 == '&') {
      while ((cVar1 == '&' || (cVar1 == ' '))) {
        pcVar3 = fmt + 1;
        fmt = fmt + 1;
        cVar1 = *pcVar3;
      }
    }
    if (cVar1 == '\0') {
      buf[end_local] = '\0';
      return end_local;
    }
    if (cVar1 == '#') {
      end_local = obj_desc_name_format(buf,max,end_local,modstr,(char *)0x0,SUB41(uVar4,0));
    }
    else if (cVar1 == '|') {
      pcVar3 = fmt + 1;
      local_40 = uVar4;
      local_38 = modstr;
      pcVar2 = strchr(pcVar3,0x7c);
      if (pcVar2 == (char *)0x0) {
        return end_local;
      }
      pcVar2 = pcVar2 + 1;
      fmt = strchr(pcVar2,0x7c);
      if (fmt == (char *)0x0) {
        return end_local;
      }
      if ((char)local_3c == '\0') {
        uVar4 = ~(uint)pcVar3 + (int)pcVar2;
      }
      else {
        uVar4 = (int)fmt - (int)pcVar2;
        pcVar3 = pcVar2;
      }
      strnfcat(buf,max,&end_local,"%.*s",(ulong)uVar4,pcVar3);
      modstr = local_38;
      uVar4 = local_40;
    }
    else if (cVar1 == '~') {
      if ((char)local_3c != '\0') {
        if (((byte)fmt[-1] - 0x68 < 0x11) && ((0x10801U >> ((byte)fmt[-1] - 0x68 & 0x1f) & 1) != 0))
        {
          pcVar3 = "es";
        }
        else {
          pcVar3 = "s";
        }
        strnfcat(buf,max,&end_local,pcVar3);
      }
    }
    else {
      buf[end_local] = cVar1;
      end_local = end_local + 1;
    }
    fmt = fmt + 1;
  } while( true );
}

Assistant:

size_t obj_desc_name_format(char *buf, size_t max, size_t end,
		const char *fmt, const char *modstr, bool pluralise)
{
	/* Copy the string */
	while (*fmt) {
		/* Skip */
		if (*fmt == '&') {
			while (*fmt == ' ' || *fmt == '&')
				fmt++;
			continue;
		} else if (*fmt == '~') {
			/* Pluralizer (regular English plurals) */
			char prev = *(fmt - 1);

			if (!pluralise)	{
				fmt++;
				continue;
			}

			/* e.g. cutlass-e-s, torch-e-s, box-e-s */
			if (prev == 's' || prev == 'h' || prev == 'x')
				strnfcat(buf, max, &end, "es");
			else
				strnfcat(buf, max, &end, "s");
		} else if (*fmt == '|') {
			/* Special plurals 
			* e.g. kni|fe|ves|
			*          ^  ^  ^ */
			const char *singular = fmt + 1;
			const char *plural   = strchr(singular, '|');
			const char *endmark  = NULL;

			if (plural) {
				plural++;
				endmark = strchr(plural, '|');
			}

			if (!singular || !plural || !endmark) return end;

			if (!pluralise)
				strnfcat(buf, max, &end, "%.*s",
					(int) (plural - singular) - 1,
					singular);
			else
				strnfcat(buf, max, &end, "%.*s",
					(int) (endmark - plural), plural);

			fmt = endmark;
		} else if (*fmt == '#') {
			/* Add modstr, with pluralisation if relevant */
			end = obj_desc_name_format(buf, max, end, modstr, NULL,	pluralise);
		}

		else
			buf[end++] = *fmt;

		fmt++;
	}

	buf[end] = 0;

	return end;
}